

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O3

BlockOrRecord * __thiscall
LLVMBC::BitcodeReader::ReadToplevelBlock(BlockOrRecord *__return_storage_ptr__,BitcodeReader *this)

{
  pointer ppBVar1;
  uint uVar2;
  size_t bitWidth;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ops).
           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->blob + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ops).
           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ops).
           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)&__return_storage_ptr__->blockDwordLength = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->blobLength + 4) = 0;
  ppBVar1 = (this->blockStack).
            super__Vector_base<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->blockStack).
      super__Vector_base<LLVMBC::BlockContext_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppBVar1) {
    bitWidth = 2;
  }
  else {
    bitWidth = ppBVar1[-1]->abbrevSize;
  }
  uVar2 = BitReader::fixed<unsigned_int>(&this->b,bitWidth);
  if (uVar2 == 1) {
    ReadBlockContents(this,__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  __assert_fail("abbrevID == ENTER_SUBBLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_decoder.cpp"
                ,0x6a,"BlockOrRecord LLVMBC::BitcodeReader::ReadToplevelBlock()");
}

Assistant:

BlockOrRecord BitcodeReader::ReadToplevelBlock()
{
  BlockOrRecord ret;

  // should hit ENTER_SUBBLOCK first for top-level block
  uint32_t abbrevID = b.fixed<uint32_t>(abbrevSize());
  (void)abbrevID;
  assert(abbrevID == ENTER_SUBBLOCK);

  ReadBlockContents(ret);

  return ret;
}